

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_opengl3.cpp
# Opt level: O3

void ImGui_ImplOpenGL3_RenderDrawData(ImDrawData *draw_data)

{
  undefined8 uVar1;
  ImDrawList *pIVar2;
  ImDrawCmd *pIVar3;
  code *pcVar4;
  undefined1 auVar5 [16];
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  undefined4 in_EAX;
  int iVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  float fVar15;
  undefined1 auVar16 [16];
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  GLuint vertex_array_object;
  GLenum last_blend_equation_alpha;
  GLenum last_blend_equation_rgb;
  GLenum last_blend_dst_alpha;
  GLenum last_blend_src_alpha;
  GLenum last_blend_dst_rgb;
  GLenum last_blend_src_rgb;
  GLint last_vertex_array_object;
  GLint last_array_buffer;
  GLint last_sampler;
  GLint last_texture;
  GLint last_program;
  GLenum last_active_texture;
  GLint last_scissor_box [4];
  GLint last_viewport [4];
  GLenum last_clip_origin;
  GLint last_polygon_mode [2];
  GLuint local_e4;
  int local_e0;
  float local_dc;
  GLenum local_d8;
  GLenum local_d4;
  GLenum local_d0;
  GLenum local_cc;
  GLenum local_c8;
  GLenum local_c4;
  GLuint local_c0;
  GLuint local_bc;
  GLuint local_b8;
  undefined4 local_b4;
  GLuint local_b0;
  GLenum local_ac;
  ImVec2 local_a8;
  undefined8 uStack_a0;
  undefined4 local_98;
  undefined4 local_94;
  undefined4 local_90;
  undefined4 local_8c;
  undefined4 local_88;
  undefined4 local_84;
  undefined4 local_80;
  undefined4 local_7c;
  int local_74;
  undefined4 local_70 [2];
  ImVec2 local_68;
  undefined8 uStack_60;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  fVar19 = (float)(int)((draw_data->FramebufferScale).x * (draw_data->DisplaySize).x);
  fVar21 = (float)(int)((draw_data->FramebufferScale).y * (draw_data->DisplaySize).y);
  auVar16._0_4_ = -(uint)(0 < (int)fVar19);
  auVar16._4_4_ = -(uint)(0 < (int)fVar19);
  auVar16._8_4_ = -(uint)(0 < (int)fVar21);
  auVar16._12_4_ = -(uint)(0 < (int)fVar21);
  iVar10 = movmskpd(in_EAX,auVar16);
  if (iVar10 == 3) {
    local_a8.y = fVar21;
    local_a8.x = fVar19;
    uStack_a0 = 0;
    glGetIntegerv(0x84e0,&local_ac);
    (*__glewActiveTexture)(0x84c0);
    glGetIntegerv(0x8b8d,&local_b0);
    glGetIntegerv(0x8069,&local_b4);
    glGetIntegerv(0x8919,&local_b8);
    glGetIntegerv(0x8894,&local_bc);
    glGetIntegerv(0x85b5,&local_c0);
    glGetIntegerv(0xb40,local_70);
    glGetIntegerv(0xba2,&local_88);
    glGetIntegerv(0xc10,&local_98);
    glGetIntegerv(0x80c9,&local_c4);
    glGetIntegerv(0x80c8,&local_c8);
    glGetIntegerv(0x80cb,&local_cc);
    glGetIntegerv(0x80ca,&local_d0);
    glGetIntegerv(0x8009,&local_d4);
    glGetIntegerv(0x883d,&local_d8);
    cVar6 = glIsEnabled(0xbe2);
    cVar7 = glIsEnabled(0xb44);
    cVar8 = glIsEnabled(0xb71);
    cVar9 = glIsEnabled(0xc11);
    local_74 = 0;
    glGetIntegerv(0x935c,&local_74);
    local_e0 = local_74;
    local_e4 = 0;
    (*__glewGenVertexArrays)(1,&local_e4);
    fVar19 = local_a8.x;
    fVar21 = local_a8.y;
    ImGui_ImplOpenGL3_SetupRenderState(draw_data,(int)local_a8.x,(int)local_a8.y,local_e4);
    if (0 < draw_data->CmdListsCount) {
      local_dc = (float)(int)fVar19;
      local_a8 = draw_data->DisplayPos;
      fVar17 = (float)(int)fVar21;
      local_68 = draw_data->FramebufferScale;
      local_48 = local_68.y;
      uStack_60 = 0;
      uStack_a0 = 0;
      local_58 = local_a8.y;
      lVar13 = 0;
      fStack_54 = local_58;
      fStack_50 = local_58;
      fStack_4c = local_58;
      fStack_44 = local_48;
      fStack_40 = local_48;
      fStack_3c = local_48;
      do {
        pIVar2 = draw_data->CmdLists[lVar13];
        (*__glewBufferData)(0x8892,(long)(pIVar2->VtxBuffer).Size * 0x14,(pIVar2->VtxBuffer).Data,
                            0x88e0);
        (*__glewBufferData)(0x8893,(long)(pIVar2->IdxBuffer).Size * 2,(pIVar2->IdxBuffer).Data,
                            0x88e0);
        if (0 < (pIVar2->CmdBuffer).Size) {
          lVar12 = 0;
          lVar14 = 0;
          do {
            pIVar3 = (pIVar2->CmdBuffer).Data;
            pcVar4 = *(code **)((long)&pIVar3->UserCallback + lVar12);
            if (pcVar4 == (code *)0x0) {
              fVar15 = (*(float *)((long)&(pIVar3->ClipRect).x + lVar12) - local_a8.x) * local_68.x;
              if ((fVar15 < local_dc) &&
                 (fVar18 = (*(float *)((long)&(pIVar3->ClipRect).y + lVar12) - local_58) * local_48,
                 fVar18 < fVar17)) {
                uVar1 = *(undefined8 *)((long)&(pIVar3->ClipRect).z + lVar12);
                fVar20 = ((float)uVar1 - local_a8.x) * local_68.x;
                fVar22 = ((float)((ulong)uVar1 >> 0x20) - local_a8.y) * local_68.y;
                auVar5._4_4_ = -(uint)(0.0 <= fVar20);
                auVar5._0_4_ = -(uint)(0.0 <= fVar20);
                auVar5._8_4_ = -(uint)(0.0 <= fVar22);
                auVar5._12_4_ = -(uint)(0.0 <= fVar22);
                uVar11 = movmskpd(0,auVar5);
                if (((uVar11 & 1) != 0) && ((byte)((byte)uVar11 >> 1) != 0)) {
                  if (local_e0 != 0x8ca2) {
                    fVar23 = fVar17 - fVar22;
                    fVar20 = fVar20 - fVar15;
                    fVar22 = fVar22 - fVar18;
                    fVar18 = fVar23;
                  }
                  glScissor((int)fVar15,(int)fVar18,(int)fVar20,(int)fVar22);
                  glBindTexture(0xde1,*(undefined4 *)((long)&pIVar3->TextureId + lVar12));
                  if (g_GlVersion < 0xc80) {
                    glDrawElements(4,*(undefined4 *)((long)&pIVar3->ElemCount + lVar12),0x1403,
                                   (ulong)*(uint *)((long)&pIVar3->IdxOffset + lVar12) * 2);
                  }
                  else {
                    (*__glewDrawElementsBaseVertex)
                              (4,*(GLsizei *)((long)&pIVar3->ElemCount + lVar12),0x1403,
                               (void *)((ulong)*(uint *)((long)&pIVar3->IdxOffset + lVar12) * 2),
                               *(GLint *)((long)&pIVar3->VtxOffset + lVar12));
                  }
                }
              }
            }
            else if (pcVar4 == (code *)0xffffffffffffffff) {
              ImGui_ImplOpenGL3_SetupRenderState(draw_data,(int)fVar19,(int)fVar21,local_e4);
            }
            else {
              (*pcVar4)(pIVar2,(long)&pIVar3->ElemCount + lVar12);
            }
            lVar14 = lVar14 + 1;
            lVar12 = lVar12 + 0x38;
          } while (lVar14 < (pIVar2->CmdBuffer).Size);
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 < draw_data->CmdListsCount);
    }
    (*__glewDeleteVertexArrays)(1,&local_e4);
    (*__glewUseProgram)(local_b0);
    glBindTexture(0xde1,local_b4);
    (*__glewBindSampler)(0,local_b8);
    (*__glewActiveTexture)(local_ac);
    (*__glewBindVertexArray)(local_c0);
    (*__glewBindBuffer)(0x8892,local_bc);
    (*__glewBlendEquationSeparate)(local_d4,local_d8);
    (*__glewBlendFuncSeparate)(local_c4,local_c8,local_cc,local_d0);
    if (cVar6 == '\0') {
      glDisable(0xbe2);
    }
    else {
      glEnable(0xbe2);
    }
    if (cVar7 == '\0') {
      glDisable(0xb44);
    }
    else {
      glEnable(0xb44);
    }
    if (cVar8 == '\0') {
      glDisable(0xb71);
    }
    else {
      glEnable(0xb71);
    }
    if (cVar9 == '\0') {
      glDisable(0xc11);
    }
    else {
      glEnable(0xc11);
    }
    glPolygonMode(0x408,local_70[0]);
    glViewport(local_88,local_84,local_80,local_7c);
    glScissor(local_98,local_94,local_90,local_8c);
  }
  return;
}

Assistant:

void    ImGui_ImplOpenGL3_RenderDrawData(ImDrawData* draw_data)
{
    // Avoid rendering when minimized, scale coordinates for retina displays (screen coordinates != framebuffer coordinates)
    int fb_width = (int)(draw_data->DisplaySize.x * draw_data->FramebufferScale.x);
    int fb_height = (int)(draw_data->DisplaySize.y * draw_data->FramebufferScale.y);
    if (fb_width <= 0 || fb_height <= 0)
        return;

    // Backup GL state
    GLenum last_active_texture; glGetIntegerv(GL_ACTIVE_TEXTURE, (GLint*)&last_active_texture);
    glActiveTexture(GL_TEXTURE0);
    GLint last_program; glGetIntegerv(GL_CURRENT_PROGRAM, &last_program);
    GLint last_texture; glGetIntegerv(GL_TEXTURE_BINDING_2D, &last_texture);
#ifdef GL_SAMPLER_BINDING
    GLint last_sampler; glGetIntegerv(GL_SAMPLER_BINDING, &last_sampler);
#endif
    GLint last_array_buffer; glGetIntegerv(GL_ARRAY_BUFFER_BINDING, &last_array_buffer);
#ifndef IMGUI_IMPL_OPENGL_ES2
    GLint last_vertex_array_object; glGetIntegerv(GL_VERTEX_ARRAY_BINDING, &last_vertex_array_object);
#endif
#ifdef GL_POLYGON_MODE
    GLint last_polygon_mode[2]; glGetIntegerv(GL_POLYGON_MODE, last_polygon_mode);
#endif
    GLint last_viewport[4]; glGetIntegerv(GL_VIEWPORT, last_viewport);
    GLint last_scissor_box[4]; glGetIntegerv(GL_SCISSOR_BOX, last_scissor_box);
    GLenum last_blend_src_rgb; glGetIntegerv(GL_BLEND_SRC_RGB, (GLint*)&last_blend_src_rgb);
    GLenum last_blend_dst_rgb; glGetIntegerv(GL_BLEND_DST_RGB, (GLint*)&last_blend_dst_rgb);
    GLenum last_blend_src_alpha; glGetIntegerv(GL_BLEND_SRC_ALPHA, (GLint*)&last_blend_src_alpha);
    GLenum last_blend_dst_alpha; glGetIntegerv(GL_BLEND_DST_ALPHA, (GLint*)&last_blend_dst_alpha);
    GLenum last_blend_equation_rgb; glGetIntegerv(GL_BLEND_EQUATION_RGB, (GLint*)&last_blend_equation_rgb);
    GLenum last_blend_equation_alpha; glGetIntegerv(GL_BLEND_EQUATION_ALPHA, (GLint*)&last_blend_equation_alpha);
    GLboolean last_enable_blend = glIsEnabled(GL_BLEND);
    GLboolean last_enable_cull_face = glIsEnabled(GL_CULL_FACE);
    GLboolean last_enable_depth_test = glIsEnabled(GL_DEPTH_TEST);
    GLboolean last_enable_scissor_test = glIsEnabled(GL_SCISSOR_TEST);
    bool clip_origin_lower_left = true;
#if defined(GL_CLIP_ORIGIN) && !defined(__APPLE__)
    GLenum last_clip_origin = 0; glGetIntegerv(GL_CLIP_ORIGIN, (GLint*)&last_clip_origin); // Support for GL 4.5's glClipControl(GL_UPPER_LEFT)
    if (last_clip_origin == GL_UPPER_LEFT)
        clip_origin_lower_left = false;
#endif

    // Setup desired GL state
    // Recreate the VAO every time (this is to easily allow multiple GL contexts to be rendered to. VAO are not shared among GL contexts)
    // The renderer would actually work without any VAO bound, but then our VertexAttrib calls would overwrite the default one currently bound.
    GLuint vertex_array_object = 0;
#ifndef IMGUI_IMPL_OPENGL_ES2
    glGenVertexArrays(1, &vertex_array_object);
#endif
    ImGui_ImplOpenGL3_SetupRenderState(draw_data, fb_width, fb_height, vertex_array_object);

    // Will project scissor/clipping rectangles into framebuffer space
    ImVec2 clip_off = draw_data->DisplayPos;         // (0,0) unless using multi-viewports
    ImVec2 clip_scale = draw_data->FramebufferScale; // (1,1) unless using retina display which are often (2,2)

    // Render command lists
    for (int n = 0; n < draw_data->CmdListsCount; n++)
    {
        const ImDrawList* cmd_list = draw_data->CmdLists[n];

        // Upload vertex/index buffers
        glBufferData(GL_ARRAY_BUFFER, (GLsizeiptr)cmd_list->VtxBuffer.Size * sizeof(ImDrawVert), (const GLvoid*)cmd_list->VtxBuffer.Data, GL_STREAM_DRAW);
        glBufferData(GL_ELEMENT_ARRAY_BUFFER, (GLsizeiptr)cmd_list->IdxBuffer.Size * sizeof(ImDrawIdx), (const GLvoid*)cmd_list->IdxBuffer.Data, GL_STREAM_DRAW);

        for (int cmd_i = 0; cmd_i < cmd_list->CmdBuffer.Size; cmd_i++)
        {
            const ImDrawCmd* pcmd = &cmd_list->CmdBuffer[cmd_i];
            if (pcmd->UserCallback != NULL)
            {
                // User callback, registered via ImDrawList::AddCallback()
                // (ImDrawCallback_ResetRenderState is a special callback value used by the user to request the renderer to reset render state.)
                if (pcmd->UserCallback == ImDrawCallback_ResetRenderState)
                    ImGui_ImplOpenGL3_SetupRenderState(draw_data, fb_width, fb_height, vertex_array_object);
                else
                    pcmd->UserCallback(cmd_list, pcmd);
            }
            else
            {
                // Project scissor/clipping rectangles into framebuffer space
                ImVec4 clip_rect;
                clip_rect.x = (pcmd->ClipRect.x - clip_off.x) * clip_scale.x;
                clip_rect.y = (pcmd->ClipRect.y - clip_off.y) * clip_scale.y;
                clip_rect.z = (pcmd->ClipRect.z - clip_off.x) * clip_scale.x;
                clip_rect.w = (pcmd->ClipRect.w - clip_off.y) * clip_scale.y;

                if (clip_rect.x < fb_width && clip_rect.y < fb_height && clip_rect.z >= 0.0f && clip_rect.w >= 0.0f)
                {
                    // Apply scissor/clipping rectangle
                    if (clip_origin_lower_left)
                        glScissor((int)clip_rect.x, (int)(fb_height - clip_rect.w), (int)(clip_rect.z - clip_rect.x), (int)(clip_rect.w - clip_rect.y));
                    else
                        glScissor((int)clip_rect.x, (int)clip_rect.y, (int)clip_rect.z, (int)clip_rect.w); // Support for GL 4.5 rarely used glClipControl(GL_UPPER_LEFT)

                    // Bind texture, Draw
                    glBindTexture(GL_TEXTURE_2D, (GLuint)(intptr_t)pcmd->TextureId);
#if IMGUI_IMPL_OPENGL_MAY_HAVE_VTX_OFFSET
                    if (g_GlVersion >= 3200)
                        glDrawElementsBaseVertex(GL_TRIANGLES, (GLsizei)pcmd->ElemCount, sizeof(ImDrawIdx) == 2 ? GL_UNSIGNED_SHORT : GL_UNSIGNED_INT, (void*)(intptr_t)(pcmd->IdxOffset * sizeof(ImDrawIdx)), (GLint)pcmd->VtxOffset);
                    else
#endif
                    glDrawElements(GL_TRIANGLES, (GLsizei)pcmd->ElemCount, sizeof(ImDrawIdx) == 2 ? GL_UNSIGNED_SHORT : GL_UNSIGNED_INT, (void*)(intptr_t)(pcmd->IdxOffset * sizeof(ImDrawIdx)));
                }
            }
        }
    }

    // Destroy the temporary VAO
#ifndef IMGUI_IMPL_OPENGL_ES2
    glDeleteVertexArrays(1, &vertex_array_object);
#endif

    // Restore modified GL state
    glUseProgram(last_program);
    glBindTexture(GL_TEXTURE_2D, last_texture);
#ifdef GL_SAMPLER_BINDING
    glBindSampler(0, last_sampler);
#endif
    glActiveTexture(last_active_texture);
#ifndef IMGUI_IMPL_OPENGL_ES2
    glBindVertexArray(last_vertex_array_object);
#endif
    glBindBuffer(GL_ARRAY_BUFFER, last_array_buffer);
    glBlendEquationSeparate(last_blend_equation_rgb, last_blend_equation_alpha);
    glBlendFuncSeparate(last_blend_src_rgb, last_blend_dst_rgb, last_blend_src_alpha, last_blend_dst_alpha);
    if (last_enable_blend) glEnable(GL_BLEND); else glDisable(GL_BLEND);
    if (last_enable_cull_face) glEnable(GL_CULL_FACE); else glDisable(GL_CULL_FACE);
    if (last_enable_depth_test) glEnable(GL_DEPTH_TEST); else glDisable(GL_DEPTH_TEST);
    if (last_enable_scissor_test) glEnable(GL_SCISSOR_TEST); else glDisable(GL_SCISSOR_TEST);
#ifdef GL_POLYGON_MODE
    glPolygonMode(GL_FRONT_AND_BACK, (GLenum)last_polygon_mode[0]);
#endif
    glViewport(last_viewport[0], last_viewport[1], (GLsizei)last_viewport[2], (GLsizei)last_viewport[3]);
    glScissor(last_scissor_box[0], last_scissor_box[1], (GLsizei)last_scissor_box[2], (GLsizei)last_scissor_box[3]);
}